

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall ON_NurbsSurface::SetDomain(ON_NurbsSurface *this,int dir,double t0,double t1)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double dVar4;
  int local_58;
  int i;
  int knot_count;
  double km;
  double d;
  double k1;
  double k0;
  bool rc;
  double t1_local;
  double t0_local;
  int dir_local;
  ON_NurbsSurface *this_local;
  
  k0._7_1_ = false;
  if ((((1 < this->m_order[dir]) && (this->m_order[dir] <= this->m_cv_count[dir])) &&
      (this->m_knot[dir] != (double *)0x0)) && (t0 < t1)) {
    dVar1 = this->m_knot[dir][this->m_order[dir] + -2];
    dVar2 = this->m_knot[dir][this->m_cv_count[dir] + -1];
    if (((dVar1 != t0) || (NAN(dVar1) || NAN(t0))) || ((dVar2 != t1 || (NAN(dVar2) || NAN(t1))))) {
      if (dVar1 < dVar2) {
        dVar4 = (t1 - t0) / (dVar2 - dVar1);
        iVar3 = KnotCount(this,dir);
        for (local_58 = 0; local_58 < iVar3; local_58 = local_58 + 1) {
          if ((dVar1 + dVar2) * 0.5 < this->m_knot[dir][local_58]) {
            this->m_knot[dir][local_58] = (this->m_knot[dir][local_58] - dVar2) * dVar4 + t1;
          }
          else {
            this->m_knot[dir][local_58] = (this->m_knot[dir][local_58] - dVar1) * dVar4 + t0;
          }
        }
        k0._7_1_ = true;
        ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
      }
    }
    else {
      k0._7_1_ = true;
    }
  }
  return k0._7_1_;
}

Assistant:

bool ON_NurbsSurface::SetDomain( 
            int dir, // 0 sets first parameter's domain, 1 gets second parameter's domain
            double t0, 
            double t1
            )
{
  bool rc = false;
  if ( m_order[dir] >= 2 && m_cv_count[dir] >= m_order[dir] && nullptr != m_knot[dir] && t0 < t1 ) {
    const double k0 = m_knot[dir][m_order[dir]-2];
    const double k1 = m_knot[dir][m_cv_count[dir]-1];
    if ( k0 == t0 && k1 == t1 )
      rc = true;
    else if ( k0 < k1 ) {
      const double d = (t1-t0)/(k1-k0);
      const double km = 0.5*(k0+k1);
      const int knot_count = KnotCount(dir);
      int i;
      for ( i = 0; i < knot_count; i++ ) {
        if ( m_knot[dir][i] <= km ) {
          m_knot[dir][i] = (m_knot[dir][i] - k0)*d + t0;
        }
        else {
          m_knot[dir][i] = (m_knot[dir][i] - k1)*d + t1;
        }
      }
			rc = true;
      DestroySurfaceTree();
    }
  }
  return rc;

}